

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

double Excel::doubleFromRK(uint32_t rk)

{
  double num;
  uint32_t rk_local;
  
  if ((rk & 2) == 0) {
    num = (double)((ulong)(rk & 0xfffffffc) << 0x20);
  }
  else {
    num = (double)(rk >> 2);
  }
  if ((rk & 1) != 0) {
    num = num / 100.0;
  }
  return num;
}

Assistant:

inline double
doubleFromRK( uint32_t rk )
{
	double num = 0;

	if( rk & 0x02 )
	{
		// int32_t
		num = (double) (rk >> 2);
	}
	else
	{
		// hi words of IEEE num
		*((uint32_t *)&num+1) = rk & 0xFFFFFFFC;
		*((uint32_t *)&num) = 0;
	}

	if( rk & 0x01 )
		// divide by 100
		num /= 100;

	return num;
}